

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNMatrix SUNSparseMatrix(sunindextype M,sunindextype N,sunindextype NNZ,int sparsetype,
                         SUNContext_conflict sunctx)

{
  SUNMatrix_Ops p_Var1;
  SUNMatrix p_Var2;
  sunindextype *psVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  
  p_Var2 = (SUNMatrix)SUNMatNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->getid = SUNMatGetID_Sparse;
  p_Var1->clone = SUNMatClone_Sparse;
  p_Var1->destroy = SUNMatDestroy_Sparse;
  p_Var1->zero = SUNMatZero_Sparse;
  p_Var1->copy = SUNMatCopy_Sparse;
  p_Var1->scaleadd = SUNMatScaleAdd_Sparse;
  p_Var1->scaleaddi = SUNMatScaleAddI_Sparse;
  p_Var1->matvec = SUNMatMatvec_Sparse;
  p_Var1->space = SUNMatSpace_Sparse;
  psVar3 = (sunindextype *)malloc(0x60);
  p_Var2->content = psVar3;
  *(int *)(psVar3 + 5) = sparsetype;
  *psVar3 = M;
  psVar3[1] = N;
  psVar3[2] = NNZ;
  if (sparsetype == 0) {
    lVar4 = 0x50;
    lVar6 = 0x48;
    lVar7 = 0x40;
    M = N;
  }
  else {
    if (sparsetype != 1) goto LAB_00155d98;
    lVar4 = 0x40;
    lVar6 = 0x58;
    lVar7 = 0x50;
  }
  psVar3[3] = M;
  *(sunindextype **)((long)psVar3 + lVar7) = psVar3 + 6;
  *(sunindextype **)((long)psVar3 + lVar6) = psVar3 + 7;
  *(undefined8 *)((long)psVar3 + lVar4) = 0;
  ((undefined8 *)((long)psVar3 + lVar4))[1] = 0;
LAB_00155d98:
  psVar3[4] = 0;
  pvVar5 = calloc(NNZ,8);
  psVar3[6] = 0;
  psVar3[7] = 0;
  psVar3[4] = (sunindextype)pvVar5;
  pvVar5 = calloc(NNZ,8);
  psVar3[6] = (sunindextype)pvVar5;
  lVar4 = psVar3[3];
  pvVar5 = calloc(lVar4 + 1,8);
  psVar3[7] = (sunindextype)pvVar5;
  *(undefined8 *)((long)pvVar5 + lVar4 * 8) = 0;
  return p_Var2;
}

Assistant:

SUNMatrix SUNSparseMatrix(sunindextype M, sunindextype N, sunindextype NNZ,
                          int sparsetype, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNMatrix A;
  SUNMatrixContent_Sparse content;

  /* return with NULL matrix on illegal input */
  SUNAssertNull(M > 0 && N > 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(NNZ >= 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(sparsetype == CSC_MAT || sparsetype == CSR_MAT,
                SUN_ERR_ARG_OUTOFRANGE);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  A->ops->getid     = SUNMatGetID_Sparse;
  A->ops->clone     = SUNMatClone_Sparse;
  A->ops->destroy   = SUNMatDestroy_Sparse;
  A->ops->zero      = SUNMatZero_Sparse;
  A->ops->copy      = SUNMatCopy_Sparse;
  A->ops->scaleadd  = SUNMatScaleAdd_Sparse;
  A->ops->scaleaddi = SUNMatScaleAddI_Sparse;
  A->ops->matvec    = SUNMatMatvec_Sparse;
  A->ops->space     = SUNMatSpace_Sparse;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Sparse)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  A->content = content;

  /* Fill content */
  content->sparsetype = sparsetype;
  content->M          = M;
  content->N          = N;
  content->NNZ        = NNZ;
  switch (sparsetype)
  {
  case CSC_MAT:
    content->NP      = N;
    content->rowvals = &(content->indexvals);
    content->colptrs = &(content->indexptrs);
    /* CSR indices */
    content->colvals = NULL;
    content->rowptrs = NULL;
    break;
  case CSR_MAT:
    content->NP      = M;
    content->colvals = &(content->indexvals);
    content->rowptrs = &(content->indexptrs);
    /* CSC indices */
    content->rowvals = NULL;
    content->colptrs = NULL;
  }
  content->data      = NULL;
  content->indexvals = NULL;
  content->indexptrs = NULL;

  /* Allocate content */
  content->data = (sunrealtype*)calloc(NNZ, sizeof(sunrealtype));
  SUNAssertNull(content->data, SUN_ERR_MALLOC_FAIL);

  content->indexvals = (sunindextype*)calloc(NNZ, sizeof(sunindextype));
  SUNAssertNull(content->indexvals, SUN_ERR_MALLOC_FAIL);

  content->indexptrs = (sunindextype*)calloc((content->NP + 1),
                                             sizeof(sunindextype));
  SUNAssertNull(content->indexptrs, SUN_ERR_MALLOC_FAIL);
  content->indexptrs[content->NP] = 0;

  return (A);
}